

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O3

vm_obj_id_t CVmObjStrComp::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  vm_obj_id_t obj_id;
  ushort *puVar4;
  ushort *puVar5;
  CVmObjStrComp *this;
  long lVar6;
  size_t equiv_cnt;
  size_t trunc_len;
  size_t total_chars;
  anon_union_8_8_cb74652f_for_val this_00;
  ulong uVar7;
  bool bVar8;
  CVmObjStrCompMapReaderList reader;
  vm_val_t val;
  vm_val_t sublst;
  vm_val_t local_68;
  undefined8 local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (argc != 3) {
    err_throw(0x899);
  }
  if (sp_[-1].typ == VM_NIL) {
    sp_ = sp_ + -1;
    trunc_len = 0;
  }
  else {
    iVar1 = CVmBif::pop_int_val();
    trunc_len = (size_t)iVar1;
  }
  iVar1 = CVmBif::pop_bool_val();
  equiv_cnt = 0;
  total_chars = 0;
  this_00.ptr = (vm_val_t *)0x0;
  if (sp_[-1].typ != VM_NIL) {
    this_00.ptr = sp_ + -1;
    iVar2 = vm_val_t::is_listlike((vm_val_t *)this_00.native_desc);
    if ((iVar2 == 0) ||
       (uVar3 = vm_val_t::ll_length((vm_val_t *)this_00.native_desc), (int)uVar3 < 0)) {
LAB_0028060d:
      err_throw(0x900);
    }
    total_chars = 0;
    if (uVar3 == 0) {
      equiv_cnt = 0;
    }
    else {
      equiv_cnt = (size_t)uVar3;
      uVar7 = 1;
      do {
        local_68.typ = VM_INT;
        local_68.val.obj = (int)uVar7;
        vm_val_t::ll_index((vm_val_t *)this_00.native_desc,&local_40,&local_68);
        iVar2 = vm_val_t::is_listlike(&local_40);
        if (iVar2 == 0) goto LAB_0028060d;
        local_68.typ = VM_INT;
        local_68.val.obj = 2;
        vm_val_t::ll_index(&local_40,&local_50,&local_68);
        puVar4 = (ushort *)vm_val_t::get_as_string(&local_50);
        if (puVar4 == (ushort *)0x0) goto LAB_0028060d;
        if ((ulong)*puVar4 == 0) {
          lVar6 = 0;
        }
        else {
          puVar5 = puVar4 + 1;
          lVar6 = 0;
          do {
            puVar5 = (ushort *)
                     ((long)puVar5 +
                     (ulong)((((byte)*puVar5 >> 5 & 1) != 0) + 1 &
                            (uint)(byte)((byte)*puVar5 >> 7) * 3) + 1);
            lVar6 = lVar6 + 1;
          } while (puVar5 < (ushort *)((long)puVar4 + (ulong)*puVar4 + 2));
        }
        total_chars = total_chars + lVar6;
        bVar8 = uVar7 != equiv_cnt;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
  }
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  this = (CVmObjStrComp *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00325c70;
  (this->super_CVmObject).ext_ = (char *)0x0;
  local_68._0_8_ = &PTR_read_mapping_00325f18;
  local_58 = 1;
  local_68.val = this_00;
  alloc_ext(this,trunc_len,iVar1,equiv_cnt,total_chars,(CVmObjStrCompMapReader *)&local_68);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjStrComp::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    size_t trunc_len;
    int case_sensitive;
    const vm_val_t *lst;
    vm_obj_id_t id;
    CVmObjStrComp *obj;
    size_t equiv_cnt;
    size_t total_chars;
    
    /* check arguments */
    if (argc != 3)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* pop the truncation length parameter */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* it's nil, so truncation is not allowed */
        trunc_len = 0;
        G_stk->discard();
    }
    else
    {
        /* retrieve the truncation length as an integer */
        trunc_len = CVmBif::pop_int_val(vmg0_);
    }

    /* get the case sensitivity flag */
    case_sensitive = CVmBif::pop_bool_val(vmg0_);

    /* 
     *   retrieve the mapping list, but leave it on the stack (for gc
     *   protection) 
     */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* there are no mappings */
        lst = 0;
        equiv_cnt = 0;
        total_chars = 0;
    }
    else
    {
        size_t i;
        int ec;
        
        /* get the list value from the argument */
        lst = G_stk->get(0);
        if (!lst->is_listlike(vmg0_)
            || (ec = lst->ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* run through the list and count the value string characters */
        for (i = 1, total_chars = 0, equiv_cnt = ec ; i <= equiv_cnt ; ++i)
        {
            vm_val_t sublst;
            vm_val_t val;
            const char *strp;
            utf8_ptr ustrp;

            /* get this mapping from the list */
            lst->ll_index(vmg_ &sublst, i);

            /* make sure it's a sublist */
            if (!sublst.is_listlike(vmg0_))
                err_throw(VMERR_BAD_TYPE_BIF);

            /* 
             *   get the second element of the mapping sublist - this is the
             *   value string 
             */
            sublst.ll_index(vmg_ &val, 2);
            if ((strp = val.get_as_string(vmg0_)) == 0)
                err_throw(VMERR_BAD_TYPE_BIF);

            /* add the character length of the string to the total */
            ustrp.set((char *)strp + VMB_LEN);
            total_chars += ustrp.len(vmb_get_len(strp));
        }
    }

    /* create the new object */
    id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    obj = new (vmg_ id) CVmObjStrComp();

    /* set up a list-based mapping reader */
    CVmObjStrCompMapReaderList reader(lst);

    /* allocate and initialize the new object's extension */
    obj->alloc_ext(vmg_ trunc_len, case_sensitive, equiv_cnt, total_chars,
                   &reader);

    /* discard the gc protection */
    G_stk->discard();

    /* return the new object */
    return id;
}